

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::basisu_transcoder::transcode_slice
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t slice_index,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,uint32_t decode_flags,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          void *pAlpha_blocks,uint32_t output_rows_in_pixels,int channel0,int channel1)

{
  basis_slice_desc *slice_desc;
  ushort uVar1;
  ushort uVar2;
  uint image_data_size;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint num_blocks_x;
  uint uVar6;
  basisu_transcoder_state *in_stack_ffffffffffffffa0;
  
  if ((decode_flags & 2) != 0) {
    return false;
  }
  if (this->m_ready_to_transcode == false) {
    return false;
  }
  bVar4 = validate_header_quick(this,pData,data_size);
  if (!bVar4) {
    return false;
  }
  if (*(uint3 *)((long)pData + 0xe) <= slice_index) {
    return false;
  }
  uVar5 = *(uint *)((long)pData + 0x41);
  lVar3 = (ulong)slice_index * 0x17;
  slice_desc = (basis_slice_desc *)((long)pData + lVar3 + (ulong)uVar5);
  uVar1 = *(ushort *)((long)pData + lVar3 + 9 + (ulong)uVar5);
  num_blocks_x = (uint)uVar1;
  uVar2 = *(ushort *)((long)pData + lVar3 + 0xb + (ulong)uVar5);
  uVar5 = (uint)uVar2;
  if (fmt - cRGB32 < 9) {
    if (output_row_pitch_in_blocks_or_pixels == 0) {
      output_row_pitch_in_blocks_or_pixels = (uint32_t)*(ushort *)(slice_desc->m_orig_width).m_bytes
      ;
    }
    if (output_rows_in_pixels == 0) {
      output_rows_in_pixels = (uint32_t)*(ushort *)(slice_desc->m_orig_height).m_bytes;
    }
    uVar6 = output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels;
  }
  else {
    if (fmt == cFXT1_RGB) {
      if (output_blocks_buf_size_in_blocks_or_pixels <
          (*(ushort *)(slice_desc->m_orig_height).m_bytes + 3 >> 2) *
          (*(ushort *)(slice_desc->m_orig_width).m_bytes + 7 >> 3)) {
        return false;
      }
      goto LAB_00147798;
    }
    uVar6 = uVar5 * num_blocks_x;
  }
  if (output_blocks_buf_size_in_blocks_or_pixels < uVar6) {
    return false;
  }
  if ((fmt & ~cETC2_RGBA) == cPVRTC1_4_RGB) {
    if (num_blocks_x == 0) {
      return false;
    }
    uVar6 = num_blocks_x - (uVar1 >> 1 & 0x5555);
    uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
    if (1 < ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return false;
    }
    if (uVar2 == 0) {
      return false;
    }
    uVar6 = uVar5 - (uVar2 >> 1 & 0x5555);
    uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
    if (1 < ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return false;
    }
  }
LAB_00147798:
  uVar6 = *(uint *)(slice_desc->m_file_ofs).m_bytes;
  if ((uVar6 <= data_size) &&
     (image_data_size = *(uint *)(slice_desc->m_file_size).m_bytes,
     image_data_size <= data_size - uVar6)) {
    if (*(char *)((long)pData + 0x14) != '\x01') {
      bVar4 = basisu_lowlevel_etc1s_transcoder::transcode_slice
                        (&this->m_lowlevel_etc1s_decoder,pOutput_blocks,num_blocks_x,uVar5,
                         (uint8_t *)((ulong)uVar6 + (long)pData),image_data_size,fmt,
                         output_block_or_pixel_stride_in_bytes,(decode_flags & 8) == 0,
                         (basis_file_header *)pData,slice_desc,output_row_pitch_in_blocks_or_pixels,
                         pState,SUB41((decode_flags & 0x10) >> 4,0),pAlpha_blocks,
                         output_rows_in_pixels);
      return bVar4;
    }
    bVar4 = basisu_lowlevel_uastc_transcoder::transcode_slice
                      ((basisu_lowlevel_uastc_transcoder *)(ulong)(uint)channel0,pOutput_blocks,
                       num_blocks_x,uVar5,(uint8_t *)((ulong)uVar6 + (long)pData),image_data_size,
                       fmt,output_block_or_pixel_stride_in_bytes,false,
                       SUB41((*(ushort *)((long)pData + 0x15) & 4) >> 2,0),
                       (uint)*(ushort *)(slice_desc->m_orig_width).m_bytes,
                       (uint)*(ushort *)(slice_desc->m_orig_height).m_bytes,
                       output_row_pitch_in_blocks_or_pixels,in_stack_ffffffffffffffa0,
                       output_rows_in_pixels,channel0,channel1,decode_flags);
    return bVar4;
  }
  return false;
}

Assistant:

bool basisu_transcoder::transcode_slice(const void* pData, uint32_t data_size, uint32_t slice_index, void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels, block_format fmt,
		uint32_t output_block_or_pixel_stride_in_bytes, uint32_t decode_flags, uint32_t output_row_pitch_in_blocks_or_pixels, basisu_transcoder_state* pState, void *pAlpha_blocks, uint32_t output_rows_in_pixels, int channel0, int channel1) const
	{
		if (!m_ready_to_transcode)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: must call start_transcoding first\n");
			return false;
		}

		if (decode_flags & cDecodeFlagsPVRTCDecodeToNextPow2)
		{
			// TODO: Not yet supported
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: cDecodeFlagsPVRTCDecodeToNextPow2 currently unsupported\n");
			return false;
		}

		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		if (slice_index >= pHeader->m_total_slices)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: slice_index >= pHeader->m_total_slices\n");
			return false;
		}

		const basis_slice_desc& slice_desc = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs)[slice_index];

		uint32_t total_4x4_blocks = slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;
		
		if (basis_block_format_is_uncompressed(fmt))
		{
			// Assume the output buffer is orig_width by orig_height
			if (!output_row_pitch_in_blocks_or_pixels)
				output_row_pitch_in_blocks_or_pixels = slice_desc.m_orig_width;

			if (!output_rows_in_pixels)
				output_rows_in_pixels = slice_desc.m_orig_height;

			// Now make sure the output buffer is large enough, or we'll overwrite memory.
			if (output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels))
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < (output_rows_in_pixels * output_row_pitch_in_blocks_or_pixels)\n");
				return false;
			}
		}
		else if (fmt == block_format::cFXT1_RGB)
		{
			const uint32_t num_blocks_fxt1_x = (slice_desc.m_orig_width + 7) / 8;
			const uint32_t num_blocks_fxt1_y = (slice_desc.m_orig_height + 3) / 4;
			const uint32_t total_blocks_fxt1 = num_blocks_fxt1_x * num_blocks_fxt1_y;

			if (output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < total_blocks_fxt1\n");
				return false;
			}
		}
		else
		{
			if (output_blocks_buf_size_in_blocks_or_pixels < total_4x4_blocks)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: output_blocks_buf_size_in_blocks_or_pixels < total_blocks\n");
				return false;
			}
		}

		if (fmt != block_format::cETC1)
		{
			if ((fmt == block_format::cPVRTC1_4_RGB) || (fmt == block_format::cPVRTC1_4_RGBA))
			{
				if ((!basisu::is_pow2(slice_desc.m_num_blocks_x * 4)) || (!basisu::is_pow2(slice_desc.m_num_blocks_y * 4)))
				{
					// PVRTC1 only supports power of 2 dimensions
					BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: PVRTC1 only supports power of 2 dimensions\n");
					return false;
				}
			}
		}

		if (slice_desc.m_file_ofs > data_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: invalid slice_desc.m_file_ofs, or passed in buffer too small\n");
			return false;
		}

		const uint32_t data_size_left = data_size - slice_desc.m_file_ofs;
		if (data_size_left < slice_desc.m_file_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::transcode_slice: invalid slice_desc.m_file_size, or passed in buffer too small\n");
			return false;
		}
				
		if (pHeader->m_tex_format == (int)basis_tex_format::cUASTC4x4)
		{
			return m_lowlevel_uastc_decoder.transcode_slice(pOutput_blocks, slice_desc.m_num_blocks_x, slice_desc.m_num_blocks_y,
				pDataU8 + slice_desc.m_file_ofs, slice_desc.m_file_size,
				fmt, output_block_or_pixel_stride_in_bytes, (decode_flags & cDecodeFlagsBC1ForbidThreeColorBlocks) == 0, *pHeader, slice_desc, output_row_pitch_in_blocks_or_pixels, pState,
				output_rows_in_pixels, channel0, channel1, decode_flags);
		}
		else
		{
			return m_lowlevel_etc1s_decoder.transcode_slice(pOutput_blocks, slice_desc.m_num_blocks_x, slice_desc.m_num_blocks_y,
				pDataU8 + slice_desc.m_file_ofs, slice_desc.m_file_size,
				fmt, output_block_or_pixel_stride_in_bytes, (decode_flags & cDecodeFlagsBC1ForbidThreeColorBlocks) == 0, *pHeader, slice_desc, output_row_pitch_in_blocks_or_pixels, pState,
				(decode_flags & cDecodeFlagsOutputHasAlphaIndices) != 0, pAlpha_blocks, output_rows_in_pixels);
		}
	}